

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc_normalize.cpp
# Opt level: O1

string_t __thiscall
duckdb::NFCNormalizeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (NFCNormalizeOperator *this,string_t input,Vector *result)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  char *pcVar5;
  ulong uVar6;
  ulong len;
  anon_union_16_2_67f50693_for_value aVar7;
  undefined8 local_28;
  char *local_20;
  ulong uVar4;
  
  local_20 = input.value._0_8_;
  local_28 = this;
  len = (ulong)this & 0xffffffff;
  pcVar5 = (char *)((long)&local_28 + 4);
  if (0xc < len) {
    pcVar5 = local_20;
  }
  uVar3 = (uint)this & 0xfffffff8;
  uVar4 = (ulong)uVar3;
  uVar6 = 8;
  do {
    if (len < uVar6) {
      if (uVar3 == (uint)this) goto LAB_014f4fc0;
      goto LAB_014f4fa8;
    }
    lVar2 = uVar6 - 8;
    uVar6 = uVar6 + 8;
  } while ((*(ulong *)(pcVar5 + lVar2) & 0x8080808080808080) == 0);
  goto LAB_014f4f7e;
  while (uVar4 = uVar6, uVar6 < len) {
LAB_014f4fa8:
    uVar6 = uVar4 + 1;
    pcVar1 = pcVar5 + uVar4;
    if (*pcVar1 < '\0') break;
  }
  if (-1 < *pcVar1) {
LAB_014f4fc0:
    aVar7.pointer.ptr = local_20;
    aVar7._0_8_ = this;
    return (string_t)aVar7;
  }
LAB_014f4f7e:
  pcVar5 = Utf8Proc::Normalize(pcVar5,len);
  aVar7.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(input.value._8_8_,pcVar5);
  free(pcVar5);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar7.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		if (IsAscii(input_data, input_length)) {
			return input;
		}
		auto normalized_str = Utf8Proc::Normalize(input_data, input_length);
		D_ASSERT(normalized_str);
		auto result_str = StringVector::AddString(result, normalized_str);
		free(normalized_str);
		return result_str;
	}